

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

ssize_t __thiscall
booster::locale::basic_message<char>::write
          (basic_message<char> *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  ostream *poVar4;
  string_type buffer;
  locale local_40 [8];
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  poVar4 = (ostream *)CONCAT44(in_register_00000034,__fd);
  std::locale::locale(local_40,(locale *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0xd0));
  booster::locale::ios_info::get((ios_base *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18)));
  uVar1 = booster::locale::ios_info::domain_id();
  local_30 = 0;
  local_28[0] = 0;
  local_38 = local_28;
  __s = (char *)write(this,(int)local_40,(void *)(ulong)uVar1,(size_t)&local_38);
  if (__s == (char *)0x0) {
    std::ios::clear(__fd + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar2);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  sVar3 = std::locale::~locale(local_40);
  return sVar3;
}

Assistant:

void write(std::basic_ostream<char_type> &out) const
            {
                std::locale const &loc = out.getloc();
                int id = ios_info::get(out).domain_id();
                string_type buffer;
                out << write(loc,id,buffer);
            }